

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_size_resp(Curl_easy *data,int ftpcode,ftpstate instate)

{
  int iVar1;
  CURLcode CVar2;
  char *__s;
  char *pcVar3;
  bool local_cd;
  char local_c8 [4];
  int clbuflen;
  char clbuf [128];
  char *fdigit;
  char *start;
  char *buf;
  curl_off_t filesize;
  ftpstate local_20;
  CURLcode result;
  ftpstate instate_local;
  int ftpcode_local;
  Curl_easy *data_local;
  
  filesize._4_4_ = CURLE_OK;
  buf = (char *)0xffffffffffffffff;
  local_20 = instate;
  result = ftpcode;
  _instate_local = data;
  if (ftpcode == 0xd5) {
    __s = (data->state).buffer + 4;
    pcVar3 = strchr(__s,0xd);
    clbuf._120_8_ = __s;
    if (pcVar3 != (char *)0x0) {
      do {
        clbuf._120_8_ = pcVar3;
        clbuf._120_8_ = clbuf._120_8_ + -1;
        iVar1 = Curl_isdigit((uint)*(byte *)clbuf._120_8_);
        local_cd = iVar1 != 0 && __s < (ulong)clbuf._120_8_;
        pcVar3 = (char *)clbuf._120_8_;
      } while (local_cd);
      iVar1 = Curl_isdigit((uint)*(byte *)clbuf._120_8_);
      if (iVar1 == 0) {
        clbuf._120_8_ = clbuf._120_8_ + 1;
      }
    }
    curlx_strtoofft((char *)clbuf._120_8_,(char **)0x0,0,(curl_off_t *)&buf);
  }
  else if ((ftpcode == 0x226) && (instate != FTP_STOR_SIZE)) {
    Curl_failf(data,"The file does not exist");
    return CURLE_REMOTE_FILE_NOT_FOUND;
  }
  if (local_20 == FTP_SIZE) {
    if (buf != (char *)0xffffffffffffffff) {
      iVar1 = curl_msnprintf(local_c8,0x80,"Content-Length: %ld\r\n",buf);
      CVar2 = Curl_client_write(_instate_local,3,local_c8,(long)iVar1);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      filesize._4_4_ = CURLE_OK;
    }
    Curl_pgrsSetDownloadSize(_instate_local,(curl_off_t)buf);
    filesize._4_4_ = ftp_state_rest(_instate_local,_instate_local->conn);
  }
  else if (local_20 == FTP_RETR_SIZE) {
    Curl_pgrsSetDownloadSize(_instate_local,(curl_off_t)buf);
    filesize._4_4_ = ftp_state_retr(_instate_local,(curl_off_t)buf);
  }
  else if (local_20 == FTP_STOR_SIZE) {
    (_instate_local->state).resume_from = (curl_off_t)buf;
    filesize._4_4_ = ftp_state_ul_setup(_instate_local,true);
  }
  return filesize._4_4_;
}

Assistant:

static CURLcode ftp_state_size_resp(struct Curl_easy *data,
                                    int ftpcode,
                                    ftpstate instate)
{
  CURLcode result = CURLE_OK;
  curl_off_t filesize = -1;
  char *buf = data->state.buffer;

  /* get the size from the ascii string: */
  if(ftpcode == 213) {
    /* To allow servers to prepend "rubbish" in the response string, we scan
       for all the digits at the end of the response and parse only those as a
       number. */
    char *start = &buf[4];
    char *fdigit = strchr(start, '\r');
    if(fdigit) {
      do
        fdigit--;
      while(ISDIGIT(*fdigit) && (fdigit > start));
      if(!ISDIGIT(*fdigit))
        fdigit++;
    }
    else
      fdigit = start;
    /* ignores parsing errors, which will make the size remain unknown */
    (void)curlx_strtoofft(fdigit, NULL, 0, &filesize);

  }
  else if(ftpcode == 550) { /* "No such file or directory" */
    /* allow a SIZE failure for (resumed) uploads, when probing what command
       to use */
    if(instate != FTP_STOR_SIZE) {
      failf(data, "The file does not exist");
      return CURLE_REMOTE_FILE_NOT_FOUND;
    }
  }

  if(instate == FTP_SIZE) {
#ifdef CURL_FTP_HTTPSTYLE_HEAD
    if(-1 != filesize) {
      char clbuf[128];
      int clbuflen = msnprintf(clbuf, sizeof(clbuf),
                "Content-Length: %" CURL_FORMAT_CURL_OFF_T "\r\n", filesize);
      result = Curl_client_write(data, CLIENTWRITE_BOTH, clbuf, clbuflen);
      if(result)
        return result;
    }
#endif
    Curl_pgrsSetDownloadSize(data, filesize);
    result = ftp_state_rest(data, data->conn);
  }
  else if(instate == FTP_RETR_SIZE) {
    Curl_pgrsSetDownloadSize(data, filesize);
    result = ftp_state_retr(data, filesize);
  }
  else if(instate == FTP_STOR_SIZE) {
    data->state.resume_from = filesize;
    result = ftp_state_ul_setup(data, TRUE);
  }

  return result;
}